

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_resize_clear(mbedtls_mpi *X,size_t limbs)

{
  int iVar1;
  
  if (limbs == 0) {
    mbedtls_mpi_free(X);
  }
  else {
    if (X->n != limbs) {
      mbedtls_mpi_free(X);
      iVar1 = mbedtls_mpi_grow(X,limbs);
      return iVar1;
    }
    memset(X->p,0,limbs << 3);
    X->s = 1;
  }
  return 0;
}

Assistant:

static int mbedtls_mpi_resize_clear(mbedtls_mpi *X, size_t limbs)
{
    if (limbs == 0) {
        mbedtls_mpi_free(X);
        return 0;
    } else if (X->n == limbs) {
        memset(X->p, 0, limbs * ciL);
        X->s = 1;
        return 0;
    } else {
        mbedtls_mpi_free(X);
        return mbedtls_mpi_grow(X, limbs);
    }
}